

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::GenericTrack::GenericTrack(GenericTrack *this,Dictionary *d)

{
  UUID *pUVar1;
  
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__GenericTrack_00223248;
  this->TrackID = 0;
  this->TrackNumber = 0;
  (this->TrackName).m_property.super_string._M_dataplus._M_p =
       (pointer)&(this->TrackName).m_property.super_string.field_2;
  (this->TrackName).m_property.super_string._M_string_length = 0;
  (this->TrackName).m_property.super_string.field_2._M_local_buf[0] = '\0';
  (this->TrackName).m_property.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__UTF16String_00221c70;
  (this->TrackName).m_has_value = false;
  (this->Sequence).m_property.super_Identifier<16U>.m_HasValue = false;
  (this->Sequence).m_property.super_Identifier<16U>.m_Value[0] = '\0';
  (this->Sequence).m_property.super_Identifier<16U>.m_Value[1] = '\0';
  (this->Sequence).m_property.super_Identifier<16U>.m_Value[2] = '\0';
  (this->Sequence).m_property.super_Identifier<16U>.m_Value[3] = '\0';
  (this->Sequence).m_property.super_Identifier<16U>.m_Value[4] = '\0';
  (this->Sequence).m_property.super_Identifier<16U>.m_Value[5] = '\0';
  (this->Sequence).m_property.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar1 = &(this->Sequence).m_property;
  (pUVar1->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->Sequence).m_property.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->Sequence).m_property.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00222020;
  (this->Sequence).m_has_value = false;
  return;
}

Assistant:

GenericTrack::GenericTrack(const Dictionary* d) : InterchangeObject(d), TrackID(0), TrackNumber(0) {}